

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O3

void __thiscall
dtc::fdt::checking::anon_unknown_4::address_cells_checker::~address_cells_checker
          (address_cells_checker *this)

{
  (this->super_checker)._vptr_checker = (_func_int **)&PTR__checker_00148038;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&(this->super_checker).path.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual bool check_node(device_tree *, const node_ptr &n)
		{
			// If this has no children, it trivially meets the
			// conditions.
			if (n->child_begin() == n->child_end())
			{
				return true;
			}
			bool found_address = false;
			bool found_size = false;
			for (auto i=n->property_begin(), e=n->property_end() ; i!=e ; ++i)
			{
				if (!found_address)
				{
					found_address = ((*i)->get_key() == "#address-cells");
				}
				if (!found_size)
				{
					found_size = ((*i)->get_key() == "#size-cells");
				}
				if (found_size && found_address)
				{
						break;
				}
			}
			if (!found_address)
			{
					report_error("Missing #address-cells property");
			}
			if (!found_size)
			{
					report_error("Missing #size-cells property");
			}
			return found_address && found_size;
		}